

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O0

bool ctemplate::AnyMightModify
               (vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
                *modifiers,PerExpandData *data)

{
  char *pcVar1;
  ulong uVar2;
  TemplateModifier *pTVar3;
  bool bVar4;
  uint uVar5;
  pointer pMVar6;
  allocator local_51;
  string local_50 [8];
  string value_string;
  __normal_iterator<const_ctemplate::ModifierAndValue_*,_std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>_>
  local_30;
  __normal_iterator<const_ctemplate::ModifierAndValue_*,_std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>_>
  local_28;
  const_iterator it;
  PerExpandData *data_local;
  vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_> *modifiers_local
  ;
  
  it._M_current = (ModifierAndValue *)data;
  local_28._M_current =
       (ModifierAndValue *)
       std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>::begin
                 (modifiers);
  while( true ) {
    local_30._M_current =
         (ModifierAndValue *)
         std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>::end
                   (modifiers);
    bVar4 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (!bVar4) break;
    pMVar6 = __gnu_cxx::
             __normal_iterator<const_ctemplate::ModifierAndValue_*,_std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>_>
             ::operator->(&local_28);
    pcVar1 = pMVar6->value;
    pMVar6 = __gnu_cxx::
             __normal_iterator<const_ctemplate::ModifierAndValue_*,_std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>_>
             ::operator->(&local_28);
    uVar2 = pMVar6->value_len;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,pcVar1,uVar2,&local_51);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    pMVar6 = __gnu_cxx::
             __normal_iterator<const_ctemplate::ModifierAndValue_*,_std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>_>
             ::operator->(&local_28);
    pTVar3 = pMVar6->modifier_info->modifier;
    uVar5 = (*pTVar3->_vptr_TemplateModifier[1])(pTVar3,it._M_current,local_50);
    bVar4 = (uVar5 & 1) != 0;
    if (bVar4) {
      modifiers_local._7_1_ = 1;
    }
    std::__cxx11::string::~string(local_50);
    if (bVar4) goto LAB_0014b195;
    __gnu_cxx::
    __normal_iterator<const_ctemplate::ModifierAndValue_*,_std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>_>
    ::operator++(&local_28);
  }
  modifiers_local._7_1_ = 0;
LAB_0014b195:
  return (bool)(modifiers_local._7_1_ & 1);
}

Assistant:

static bool AnyMightModify(const vector<ModifierAndValue>& modifiers,
                           const PerExpandData* data) {
  for (vector<ModifierAndValue>::const_iterator it = modifiers.begin();
       it != modifiers.end();  ++it) {
    string value_string(it->value, it->value_len);
    if (it->modifier_info->modifier->MightModify(data, value_string)) {
      return true;
    }
  }
  return false;
}